

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lisp2c.c
# Opt level: O2

void LispStringToCStr(LispPTR lispstring,char *cstring)

{
  uint uVar1;
  uint uVar2;
  LispPTR LVar3;
  DLword *pDVar4;
  LispPTR *pLVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  
  pLVar5 = NativeAligned4FromLAddr(lispstring);
  pDVar4 = Lisp_world;
  uVar1 = pLVar5[2];
  uVar6 = (ulong)(int)uVar1;
  if (*(char *)((long)pLVar5 + 6) == 'D') {
    uVar1 = *pLVar5;
    LVar3 = pLVar5[1];
    uVar6 = uVar6 * 2;
    uVar7 = 0;
    uVar8 = 0;
    if (0 < (int)uVar6) {
      uVar8 = uVar6 & 0xffffffff;
    }
    for (; uVar8 != uVar7; uVar7 = uVar7 + 1) {
      cstring[uVar7] =
           *(char *)((long)pDVar4 +
                    uVar7 + (ulong)(ushort)LVar3 * 2 + (ulong)(uVar1 & 0xfffffff) * 2);
    }
  }
  else {
    if (*(char *)((long)pLVar5 + 6) != 'C') {
      error("Arg not Lisp string.\n");
      return;
    }
    uVar2 = *pLVar5;
    LVar3 = pLVar5[1];
    uVar7 = 0;
    uVar8 = 0;
    if (0 < (int)uVar1) {
      uVar8 = (ulong)uVar1;
    }
    for (; uVar8 != uVar7; uVar7 = uVar7 + 1) {
      cstring[uVar7] =
           *(char *)((long)pDVar4 + uVar7 + (ulong)(ushort)LVar3 + (ulong)(uVar2 & 0xfffffff) * 2);
    }
  }
  cstring[uVar6] = '\0';
  return;
}

Assistant:

void LispStringToCStr(LispPTR lispstring, char *cstring) {
  OneDArray *arrayp;
  char *base;
  short *sbase;
  int i, Len;

  arrayp = (OneDArray *)(NativeAligned4FromLAddr(lispstring));
  Len = arrayp->fillpointer;

  switch (arrayp->typenumber) {
    case THIN_CHAR_TYPENUMBER:
      base = ((char *)(NativeAligned2FromLAddr(arrayp->base))) + ((int)(arrayp->offset));
      for (i = 0; i < Len; i++) cstring[i] = base[i];
      cstring[Len] = '\0';
      break;

    case FAT_CHAR_TYPENUMBER:
      sbase = ((short *)(NativeAligned2FromLAddr(arrayp->base))) + ((int)(arrayp->offset));
      base = (char *)sbase;
      for (i = 0; i < Len * 2; i++) cstring[i] = base[i];
      cstring[Len * 2] = '\0';
      break;

    default: error("Arg not Lisp string.\n");
  }
}